

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O2

void __thiscall
tchecker::details::extract_variables_visitor_t::extract_variable_with_type
          (extract_variables_visitor_t *this,variable_id_t id,expression_type_t type)

{
  invalid_argument *this_00;
  long lStack_20;
  variable_id_t id_local;
  
  if ((type & ~EXPR_TYPE_INTTERM) == EXPR_TYPE_INTVAR) {
    lStack_20 = 0x10;
  }
  else {
    if ((type & ~EXPR_TYPE_INTTERM) != EXPR_TYPE_CLKVAR) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"typed expression is not well-typed");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    lStack_20 = 8;
  }
  std::__detail::
  _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::insert(*(_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             **)((long)&(this->super_typed_expression_visitor_t)._vptr_typed_expression_visitor_t +
                lStack_20),&id_local);
  return;
}

Assistant:

void extract_variable_with_type(tchecker::variable_id_t id, enum tchecker::expression_type_t type)
  {
    if ((type == tchecker::EXPR_TYPE_INTVAR) || (type == tchecker::EXPR_TYPE_INTARRAY))
      _intvars.insert(id);
    else if ((type == tchecker::EXPR_TYPE_CLKVAR) || (type == tchecker::EXPR_TYPE_CLKARRAY))
      _clocks.insert(id);
    else
      throw std::invalid_argument("typed expression is not well-typed");
  }